

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O3

void tommy_hashdyn_resize(tommy_hashdyn *hashdyn,tommy_count_t new_bucket_bit)

{
  uint uVar1;
  long lVar2;
  tommy_hashdyn_node *ptVar3;
  tommy_count_t i;
  tommy_node_struct *ptVar4;
  ulong uVar5;
  tommy_node_struct *ptVar6;
  uint uVar7;
  tommy_node_struct *ptVar8;
  tommy_node_struct *ptVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = 1 << ((byte)new_bucket_bit & 0x1f);
  uVar7 = hashdyn->bucket_bit;
  uVar1 = hashdyn->bucket_max;
  ptVar4 = (tommy_node_struct *)lrtr_malloc((ulong)uVar10 * 8);
  if (uVar7 < new_bucket_bit) {
    if ((ulong)uVar1 != 0) {
      uVar5 = 0;
      do {
        (&ptVar4->next)[uVar5] = (tommy_node_struct *)0x0;
        (&ptVar4->next)[(int)uVar5 + uVar1] = (tommy_node_struct *)0x0;
        ptVar3 = hashdyn->bucket[uVar5];
        while (ptVar3 != (tommy_hashdyn_node *)0x0) {
          ptVar6 = ptVar3->next;
          uVar7 = ptVar3->key & uVar10 - 1;
          ptVar8 = (&ptVar4->next)[uVar7];
          if (ptVar8 == (tommy_node_struct *)0x0) {
            ptVar8 = (tommy_node_struct *)(&ptVar4->next + uVar7);
            ptVar3->prev = ptVar3;
            ptVar3->next = (tommy_node_struct *)0x0;
          }
          else {
            ptVar3->prev = ptVar8->prev;
            ptVar8->prev = ptVar3;
            ptVar3->next = (tommy_node_struct *)0x0;
            ptVar8 = ptVar3->prev;
          }
          ptVar8->next = ptVar3;
          ptVar3 = ptVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
    }
  }
  else {
    uVar5 = 0;
    ptVar6 = ptVar4;
    do {
      ptVar3 = hashdyn->bucket[uVar5];
      ptVar6->next = ptVar3;
      ptVar8 = hashdyn->bucket[uVar10 + (int)uVar5];
      if (ptVar8 != (tommy_node_struct *)0x0) {
        ptVar9 = ptVar6;
        if (ptVar3 != (tommy_hashdyn_node *)0x0) {
          ptVar9 = ptVar3->prev;
          ptVar3->prev = ptVar8->prev;
          ptVar8->prev = ptVar9;
        }
        ptVar9->next = ptVar8;
      }
      uVar5 = uVar5 + 1;
      ptVar6 = (tommy_node_struct *)&ptVar6->prev;
    } while (uVar10 != uVar5);
  }
  lrtr_free(hashdyn->bucket);
  hashdyn->bucket_bit = new_bucket_bit;
  hashdyn->bucket_max = uVar10;
  hashdyn->bucket_mask = uVar10 - 1;
  hashdyn->bucket = (tommy_hashdyn_node **)ptVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void tommy_hashdyn_resize(tommy_hashdyn* hashdyn, tommy_count_t new_bucket_bit)
{
	tommy_count_t bucket_bit;
	tommy_count_t bucket_max;
	tommy_count_t new_bucket_max;
	tommy_count_t new_bucket_mask;
	tommy_hashdyn_node** new_bucket;

	bucket_bit = hashdyn->bucket_bit;
	bucket_max = hashdyn->bucket_max;

	new_bucket_max = 1 << new_bucket_bit;
	new_bucket_mask = new_bucket_max - 1;

	/* allocate the new vector using malloc() and not calloc() */
	/* because data is fully initialized in the update process */
	new_bucket = tommy_cast(tommy_hashdyn_node**, tommy_malloc(new_bucket_max * sizeof(tommy_hashdyn_node*)));

	/* reinsert all the elements */
	if (new_bucket_bit > bucket_bit) {
		tommy_count_t i;

		/* grow */
		for (i = 0; i < bucket_max; ++i) {
			tommy_hashdyn_node* j;

			/* setup the new two buckets */
			new_bucket[i] = 0;
			new_bucket[i + bucket_max] = 0;

			/* reinsert the bucket */
			j = hashdyn->bucket[i];
			while (j) {
				tommy_hashdyn_node* j_next = j->next;
				tommy_count_t pos = j->key & new_bucket_mask;
				if (new_bucket[pos])
					tommy_list_insert_tail_not_empty(new_bucket[pos], j);
				else
					tommy_list_insert_first(&new_bucket[pos], j);
				j = j_next;
			}
		}
	} else {
		tommy_count_t i;

		/* shrink */
		for (i = 0; i < new_bucket_max; ++i) {
			/* setup the new bucket with the lower bucket*/
			new_bucket[i] = hashdyn->bucket[i];

			/* concat the upper bucket */
			tommy_list_concat(&new_bucket[i], &hashdyn->bucket[i + new_bucket_max]);
		}
	}

	tommy_free(hashdyn->bucket);

	/* setup */
	hashdyn->bucket_bit = new_bucket_bit;
	hashdyn->bucket_max = new_bucket_max;
	hashdyn->bucket_mask = new_bucket_mask;
	hashdyn->bucket = new_bucket;
}